

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O3

int ngram_fwdtree_search(ngram_search_t *ngs,int frame_idx)

{
  uint *puVar1;
  short sVar2;
  s3ssid_t sVar3;
  uint16 uVar4;
  uint uVar5;
  acmod_t *acmod;
  ps_search_t *ppVar6;
  dictword_t *pdVar7;
  bitvec_t *pbVar8;
  int32 **ppiVar9;
  dict_t *pdVar10;
  bin_mdef_t *pbVar11;
  int32 *piVar12;
  s3cipid_t *psVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  chan_s **ppcVar18;
  int32 iVar19;
  int iVar20;
  uint uVar21;
  int32 iVar22;
  int16 *piVar23;
  chan_t ***pppcVar24;
  cand_sf_t *pcVar25;
  int32 *piVar26;
  chan_t **ppcVar27;
  last_ltrans_t *plVar28;
  ulong uVar29;
  lastphn_cand_t *plVar30;
  bestbp_rc_t *pbVar31;
  root_chan_t *prVar32;
  chan_t *pcVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  ulong uVar37;
  uint *puVar38;
  bptbl_t *pbVar39;
  uint *puVar40;
  bptbl_t *pbVar41;
  int iVar42;
  int *piVar43;
  bptbl_t *pbVar44;
  chan_s **ppcVar45;
  long lVar46;
  int iVar47;
  chan_s *pcVar48;
  long lVar49;
  uint uVar50;
  uint uVar51;
  long lVar52;
  lastphn_cand_t *plVar53;
  int iVar54;
  uint uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  uint *local_490;
  chan_t **local_480;
  uint local_46c;
  dict2pid_t *local_468;
  uint *local_460;
  uint *local_458;
  ulong local_450;
  uint *local_448;
  ulong local_440;
  int32 local_438 [258];
  
  acmod = (ngs->base).acmod;
  local_46c = frame_idx;
  if (acmod->compallsen == '\0') {
    acmod_clear_active(acmod);
    if (0 < ngs->n_root_chan) {
      prVar32 = ngs->root_chan;
      iVar54 = ngs->n_root_chan + 1;
      do {
        if ((prVar32->hmm).frame == frame_idx) {
          acmod_activate_hmm((ngs->base).acmod,&prVar32->hmm);
        }
        prVar32 = prVar32 + 1;
        iVar54 = iVar54 + -1;
      } while (1 < iVar54);
    }
    uVar50 = frame_idx & 1;
    if (0 < ngs->n_active_chan[uVar50]) {
      ppcVar27 = ngs->active_chan_list[uVar50];
      uVar55 = ngs->n_active_chan[uVar50] + 1;
      do {
        pcVar33 = *ppcVar27;
        ppcVar27 = ppcVar27 + 1;
        acmod_activate_hmm((ngs->base).acmod,&pcVar33->hmm);
        uVar55 = uVar55 - 1;
      } while (1 < uVar55);
    }
    if (0 < ngs->n_active_word[uVar50]) {
      piVar43 = ngs->active_word_list[uVar50];
      iVar54 = ngs->n_active_word[uVar50];
      do {
        for (pcVar33 = ngs->word_chan[*piVar43]; pcVar33 != (chan_t *)0x0; pcVar33 = pcVar33->next)
        {
          acmod_activate_hmm((ngs->base).acmod,&pcVar33->hmm);
        }
        piVar43 = piVar43 + 1;
        bVar14 = 1 < iVar54;
        iVar54 = iVar54 + -1;
      } while (bVar14);
    }
    iVar54 = ngs->n_1ph_words;
    if (0 < iVar54) {
      lVar52 = 0;
      do {
        if ((ngs->word_chan[ngs->single_phone_wid[lVar52]]->hmm).frame == frame_idx) {
          acmod_activate_hmm((ngs->base).acmod,&ngs->word_chan[ngs->single_phone_wid[lVar52]]->hmm);
          iVar54 = ngs->n_1ph_words;
        }
        lVar52 = lVar52 + 1;
      } while (lVar52 < iVar54);
    }
  }
  piVar23 = acmod_score((ngs->base).acmod,(int *)&local_46c);
  iVar54 = 0;
  if (piVar23 != (int16 *)0x0) {
    piVar26 = &(ngs->st).n_senone_active_utt;
    *piVar26 = *piVar26 + ((ngs->base).acmod)->n_senone_active;
    ngram_search_mark_bptable(ngs,local_46c);
    iVar54 = 0;
    if (-0x20000000 < ngs->best_score) {
      if (ngs->best_score + ngs->beam * 2 < -0x20000000) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                ,0x5c5,"Renormalizing Scores at frame %d, best score %d\n",(ulong)local_46c);
        uVar50 = local_46c;
        iVar19 = ngs->best_score;
        if (0 < ngs->n_root_chan) {
          prVar32 = ngs->root_chan;
          iVar54 = ngs->n_root_chan + 1;
          do {
            if ((prVar32->hmm).frame == uVar50) {
              hmm_normalize(&prVar32->hmm,iVar19);
            }
            prVar32 = prVar32 + 1;
            iVar54 = iVar54 + -1;
          } while (1 < iVar54);
        }
        uVar55 = uVar50 & 1;
        if (0 < ngs->n_active_chan[uVar55]) {
          ppcVar27 = ngs->active_chan_list[uVar55];
          uVar51 = ngs->n_active_chan[uVar55] + 1;
          do {
            pcVar33 = *ppcVar27;
            ppcVar27 = ppcVar27 + 1;
            hmm_normalize(&pcVar33->hmm,iVar19);
            uVar51 = uVar51 - 1;
          } while (1 < uVar51);
        }
        if (0 < ngs->n_active_word[uVar55]) {
          piVar43 = ngs->active_word_list[uVar55];
          iVar54 = ngs->n_active_word[uVar55];
          do {
            for (pcVar33 = ngs->word_chan[*piVar43]; pcVar33 != (chan_t *)0x0;
                pcVar33 = pcVar33->next) {
              hmm_normalize(&pcVar33->hmm,iVar19);
            }
            piVar43 = piVar43 + 1;
            bVar14 = 1 < iVar54;
            iVar54 = iVar54 + -1;
          } while (bVar14);
        }
        iVar54 = ngs->n_1ph_words;
        if (0 < iVar54) {
          lVar52 = 0;
          do {
            if ((ngs->word_chan[ngs->single_phone_wid[lVar52]]->hmm).frame == uVar50) {
              hmm_normalize(&ngs->word_chan[ngs->single_phone_wid[lVar52]]->hmm,iVar19);
              iVar54 = ngs->n_1ph_words;
            }
            lVar52 = lVar52 + 1;
          } while (lVar52 < iVar54);
        }
        ngs->renormalized = 1;
      }
      uVar50 = local_46c;
      ngs->hmmctx->senscore = piVar23;
      iVar42 = -0x20000000;
      iVar54 = -0x20000000;
      if (0 < ngs->n_root_chan) {
        prVar32 = ngs->root_chan;
        iVar47 = ngs->n_root_chan + 1;
        do {
          if ((prVar32->hmm).frame == uVar50) {
            iVar19 = hmm_vit_eval(&prVar32->hmm);
            if (iVar54 < iVar19) {
              iVar54 = iVar19;
            }
            piVar26 = &(ngs->st).n_root_chan_eval;
            *piVar26 = *piVar26 + 1;
          }
          prVar32 = prVar32 + 1;
          iVar47 = iVar47 + -1;
        } while (1 < iVar47);
      }
      ngs->best_score = iVar54;
      uVar55 = uVar50 & 1;
      iVar47 = ngs->n_active_chan[uVar55];
      ppcVar27 = ngs->active_chan_list[uVar55];
      piVar26 = &(ngs->st).n_nonroot_chan_eval;
      *piVar26 = *piVar26 + iVar47;
      if (0 < iVar47) {
        iVar47 = iVar47 + 1;
        iVar42 = -0x20000000;
        do {
          pcVar33 = *ppcVar27;
          iVar19 = hmm_vit_eval(&pcVar33->hmm);
          if ((pcVar33->hmm).frame != uVar50) {
            __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x27c,"int32 eval_nonroot_chan(ngram_search_t *, int)");
          }
          ppcVar27 = ppcVar27 + 1;
          if (iVar42 < iVar19) {
            iVar42 = iVar19;
          }
          iVar47 = iVar47 + -1;
        } while (1 < iVar47);
        iVar54 = ngs->best_score;
      }
      if (iVar54 < iVar42) {
        ngs->best_score = iVar42;
      }
      if (ngs->n_active_word[uVar55] < 1) {
        iVar54 = -0x20000000;
        iVar42 = 0;
      }
      else {
        local_490 = (uint *)ngs->active_word_list[uVar55];
        iVar54 = -0x20000000;
        iVar42 = 0;
        iVar47 = ngs->n_active_word[uVar55];
        do {
          uVar51 = *local_490;
          uVar21 = uVar51 + 0x1f;
          if (-1 < (long)(int)uVar51) {
            uVar21 = uVar51;
          }
          uVar5 = ngs->word_active[(int)uVar21 >> 5];
          if ((uVar5 >> (uVar51 & 0x1f) & 1) == 0) {
            __assert_fail("bitvec_is_set(ngs->word_active, w)",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x291,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          ngs->word_active[(int)uVar21 >> 5] = uVar5 & ~(uint)(1L << ((byte)uVar51 & 0x1f));
          pcVar33 = ngs->word_chan[(int)uVar51];
          if (pcVar33 == (chan_t *)0x0) {
            __assert_fail("ngs->word_chan[w] != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x293,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          local_490 = local_490 + 1;
          do {
            if ((pcVar33->hmm).frame != uVar50) {
              __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x298,"int32 eval_word_chan(ngram_search_t *, int)");
            }
            iVar19 = hmm_vit_eval(&pcVar33->hmm);
            if (iVar54 < iVar19) {
              iVar54 = iVar19;
            }
            iVar42 = iVar42 + 1;
            pcVar33 = pcVar33->next;
          } while (pcVar33 != (chan_s *)0x0);
          bVar14 = 1 < iVar47;
          iVar47 = iVar47 + -1;
        } while (bVar14);
      }
      iVar47 = ngs->n_1ph_words;
      if (iVar47 < 1) {
        iVar35 = 0;
      }
      else {
        lVar52 = 0;
        iVar35 = 0;
        do {
          iVar36 = ngs->single_phone_wid[lVar52];
          if ((int)uVar50 <= (ngs->word_chan[iVar36]->hmm).frame) {
            iVar19 = hmm_vit_eval(&ngs->word_chan[iVar36]->hmm);
            if ((iVar54 < iVar19) && (iVar36 != (ngs->base).finish_wid)) {
              iVar54 = iVar19;
            }
            iVar35 = iVar35 + 1;
            iVar47 = ngs->n_1ph_words;
          }
          lVar52 = lVar52 + 1;
        } while (lVar52 < iVar47);
      }
      uVar50 = local_46c;
      piVar26 = &(ngs->st).n_last_chan_eval;
      *piVar26 = *piVar26 + iVar42 + iVar35;
      iVar47 = iVar42 + iVar35 + (ngs->st).n_nonroot_chan_eval;
      (ngs->st).n_nonroot_chan_eval = iVar47;
      piVar26 = &(ngs->st).n_word_lastchan_eval;
      *piVar26 = *piVar26 + iVar35 + ngs->n_active_word[uVar55];
      iVar42 = ngs->best_score;
      if (ngs->best_score < iVar54) {
        ngs->best_score = iVar54;
        iVar42 = iVar54;
      }
      ngs->last_phone_best_score = iVar54;
      ngs->n_lastphn_cand = 0;
      iVar54 = ngs->beam;
      iVar35 = ngs->maxhmmpf;
      ngs->dynamic_beam = iVar54;
      if (iVar35 == -1) {
        iVar36 = ngs->n_root_chan;
      }
      else {
        iVar36 = ngs->n_root_chan;
        if (iVar35 < iVar47 + (ngs->st).n_root_chan_eval) {
          iVar47 = iVar54 + 0xff;
          if (-1 < iVar54) {
            iVar47 = iVar54;
          }
          iVar54 = -(iVar47 >> 8);
          memset(local_438,0,0x400);
          if (0 < iVar36) {
            piVar26 = &(ngs->root_chan->hmm).bestscore;
            iVar47 = iVar36;
            do {
              iVar20 = (iVar42 - *piVar26) / iVar54;
              if (0xfe < iVar20) {
                iVar20 = 0xff;
              }
              local_438[iVar20] = local_438[iVar20] + 1;
              piVar26 = piVar26 + 0x1c;
              iVar47 = iVar47 + -1;
            } while (iVar47 != 0);
          }
          if (0 < ngs->n_active_chan[uVar50 & 1]) {
            ppcVar27 = ngs->active_chan_list[uVar50 & 1];
            uVar55 = ngs->n_active_chan[uVar50 & 1] + 1;
            do {
              iVar47 = (iVar42 - ((*ppcVar27)->hmm).bestscore) / iVar54;
              if (0xfe < iVar47) {
                iVar47 = 0xff;
              }
              local_438[iVar47] = local_438[iVar47] + 1;
              ppcVar27 = ppcVar27 + 1;
              uVar55 = uVar55 - 1;
            } while (1 < uVar55);
          }
          lVar52 = 0;
          iVar47 = 0;
          do {
            iVar47 = iVar47 + local_438[lVar52];
            if (iVar35 < iVar47) goto LAB_0013b8dc;
            lVar52 = lVar52 + 1;
          } while (lVar52 != 0x100);
          lVar52 = 0x100;
LAB_0013b8dc:
          iVar54 = -(iVar54 * (int)lVar52);
          ngs->dynamic_beam = iVar54;
        }
      }
      uVar55 = uVar50 + 1;
      puVar40 = (uint *)(ulong)(uint)(iVar54 + iVar42);
      iVar54 = ngs->pbeam + iVar42;
      iVar42 = iVar42 + ngs->lpbeam;
      pppcVar24 = ngs->active_chan_list;
      local_450 = (ulong)(uVar55 & 1);
      ppcVar27 = pppcVar24[local_450];
      local_480 = ppcVar27;
      if (0 < iVar36) {
        local_468 = (dict2pid_t *)CONCAT44(local_468._4_4_,iVar42);
        ppVar6 = (ngs->base).pls;
        prVar32 = ngs->root_chan;
        iVar42 = 0;
        local_458 = puVar40;
        do {
          if (((int)uVar50 <= (prVar32->hmm).frame) && ((int)puVar40 < (prVar32->hmm).bestscore)) {
            (prVar32->hmm).frame = uVar55;
            iVar47 = ngs->pip + (prVar32->hmm).out_score;
            if ((ppVar6 != (ps_search_t *)0x0) || (iVar54 < iVar47)) {
              for (pcVar33 = prVar32->next; pcVar33 != (chan_t *)0x0; pcVar33 = pcVar33->alt) {
                if (ppVar6 == (ps_search_t *)0x0) {
                  iVar35 = 0;
                }
                else {
                  iVar35 = *(int *)((long)&(ppVar6[1].acmod)->config + (long)pcVar33->ciphone * 4);
                }
                if ((iVar54 < iVar35 + iVar47) &&
                   (((pcVar33->hmm).frame < (int)uVar50 || ((pcVar33->hmm).score[0] < iVar47)))) {
                  hmm_enter(&pcVar33->hmm,iVar47,(prVar32->hmm).out_history,uVar55);
                  *local_480 = pcVar33;
                  local_480 = local_480 + 1;
                }
              }
            }
            puVar40 = local_458;
            if (((ppVar6 != (ps_search_t *)0x0) || ((int)local_468 < iVar47)) &&
               (uVar51 = prVar32->penult_phn_wid, -1 < (int)uVar51)) {
              piVar26 = ngs->homophone_set;
              do {
                if (ppVar6 == (ps_search_t *)0x0) {
                  iVar35 = 0;
                }
                else {
                  pdVar7 = ((ngs->base).dict)->word;
                  iVar35 = *(int *)((long)&(ppVar6[1].acmod)->config +
                                   (long)pdVar7[uVar51].ciphone[(long)pdVar7[uVar51].pronlen + -1] *
                                   4);
                }
                if ((int)local_468 < iVar35 + iVar47) {
                  plVar53 = ngs->lastphn_cand;
                  iVar35 = ngs->n_lastphn_cand;
                  ngs->n_lastphn_cand = iVar35 + 1;
                  plVar53[iVar35].wid = uVar51;
                  plVar53[iVar35].score = iVar47 - ngs->nwpen;
                  plVar53[iVar35].bp = (prVar32->hmm).out_history;
                }
                uVar51 = piVar26[uVar51];
              } while (-1 < (int)uVar51);
            }
          }
          iVar42 = iVar42 + 1;
          prVar32 = prVar32 + 1;
        } while (iVar42 < ngs->n_root_chan);
        pppcVar24 = ngs->active_chan_list;
        ppcVar27 = pppcVar24[local_450];
        iVar42 = ngs->best_score;
        puVar40 = (uint *)(ulong)(uint)(ngs->dynamic_beam + iVar42);
        iVar54 = ngs->pbeam + iVar42;
        iVar42 = iVar42 + ngs->lpbeam;
      }
      iVar47 = (int)((ulong)((long)local_480 - (long)ppcVar27) >> 3);
      ngs->n_active_chan[local_450] = iVar47;
      local_440 = (ulong)(uVar50 & 1);
      local_480 = ppcVar27 + iVar47;
      uVar51 = ngs->n_active_chan[local_440];
      if (0 < (int)uVar51) {
        ppcVar27 = pppcVar24[local_440];
        ppVar6 = (ngs->base).pls;
        local_468 = (dict2pid_t *)CONCAT44(local_468._4_4_,iVar42);
        local_458 = puVar40;
        do {
          local_460 = (uint *)(ulong)uVar51;
          pcVar33 = *ppcVar27;
          uVar51 = (pcVar33->hmm).frame;
          if ((int)uVar51 < (int)uVar50) {
            __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x335,"void prune_nonroot_chan(ngram_search_t *, int)");
          }
          if ((int)puVar40 < (pcVar33->hmm).bestscore) {
            if (uVar51 != uVar55) {
              (pcVar33->hmm).frame = uVar55;
              *local_480 = pcVar33;
              local_480 = local_480 + 1;
            }
            iVar42 = ngs->pip + (pcVar33->hmm).out_score;
            if ((ppVar6 != (ps_search_t *)0x0) || (iVar54 < iVar42)) {
              for (pcVar48 = pcVar33->next; pcVar48 != (chan_s *)0x0; pcVar48 = pcVar48->alt) {
                if (ppVar6 == (ps_search_t *)0x0) {
                  iVar47 = 0;
                }
                else {
                  iVar47 = *(int *)((long)&(ppVar6[1].acmod)->config + (long)pcVar48->ciphone * 4);
                }
                if ((iVar54 < iVar47 + iVar42) &&
                   ((uVar51 = (pcVar48->hmm).frame, (int)uVar51 < (int)uVar50 ||
                    ((pcVar48->hmm).score[0] < iVar42)))) {
                  if (uVar51 != uVar55) {
                    *local_480 = pcVar48;
                    local_480 = local_480 + 1;
                  }
                  hmm_enter(&pcVar48->hmm,iVar42,(pcVar33->hmm).out_history,uVar55);
                }
              }
            }
            puVar40 = local_458;
            if (((ppVar6 != (ps_search_t *)0x0) || ((int)local_468 < iVar42)) &&
               (uVar51 = (pcVar33->info).penult_phn_wid, -1 < (int)uVar51)) {
              piVar26 = ngs->homophone_set;
              do {
                if (ppVar6 == (ps_search_t *)0x0) {
                  iVar47 = 0;
                }
                else {
                  pdVar7 = ((ngs->base).dict)->word;
                  iVar47 = *(int *)((long)&(ppVar6[1].acmod)->config +
                                   (long)pdVar7[uVar51].ciphone[(long)pdVar7[uVar51].pronlen + -1] *
                                   4);
                }
                if ((int)local_468 < iVar47 + iVar42) {
                  plVar53 = ngs->lastphn_cand;
                  iVar47 = ngs->n_lastphn_cand;
                  ngs->n_lastphn_cand = iVar47 + 1;
                  plVar53[iVar47].wid = uVar51;
                  plVar53[iVar47].score = iVar42 - ngs->nwpen;
                  plVar53[iVar47].bp = (pcVar33->hmm).out_history;
                }
                uVar51 = piVar26[uVar51];
              } while (-1 < (int)uVar51);
            }
          }
          else if (uVar51 != uVar55) {
            hmm_clear(&pcVar33->hmm);
          }
          ppcVar27 = ppcVar27 + 1;
          uVar51 = (int)local_460 - 1;
        } while (1 < (int)local_460);
        ppcVar27 = ngs->active_chan_list[local_450];
      }
      ngs->n_active_chan[local_450] = (int32)((ulong)((long)local_480 - (long)ppcVar27) >> 3);
      local_460 = (uint *)ngs->active_word_list[local_450];
      iVar54 = ngs->n_lastphn_cand;
      piVar26 = &(ngs->st).n_lastphn_cand_utt;
      *piVar26 = *piVar26 + iVar54;
      if (0 < iVar54) {
        plVar53 = ngs->lastphn_cand;
        iVar54 = 0;
        uVar51 = 0;
        do {
          if ((long)plVar53->bp != -1) {
            pbVar44 = ngs->bp_table + plVar53->bp;
            iVar19 = ngram_search_exit_score
                               (ngs,pbVar44,(int)*((ngs->base).dict)->word[plVar53->wid].ciphone);
            if (iVar19 < -0x1fffffff) {
              __assert_fail("start_score BETTER_THAN WORST_SCORE",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x392,"void last_phone_transition(ngram_search_t *, int)");
            }
            plVar53->score = plVar53->score - iVar19;
            plVar28 = ngs->last_ltrans;
            lVar52 = (long)plVar53->wid;
            iVar42 = pbVar44->frame + 1;
            if (plVar28[lVar52].sf != iVar42) {
              if (0 < (int)uVar51) {
                pcVar25 = ngs->cand_sf;
                uVar29 = 0;
                do {
                  if (pcVar25[uVar29].bp_ef == pbVar44->frame) {
                    plVar53->next = pcVar25[uVar29].cand;
                    goto LAB_0013bebf;
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar51 != uVar29);
              }
              iVar42 = ngs->cand_sf_alloc;
              if (iVar42 <= (int)uVar51) {
                if (iVar42 == 0) {
                  pcVar25 = (cand_sf_t *)
                            __ckd_calloc__(0x20,8,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                           ,0x3ab);
                  ngs->cand_sf = pcVar25;
                  ngs->cand_sf_alloc = 0x20;
                }
                else {
                  ngs->cand_sf_alloc = iVar42 + 0x20;
                  pcVar25 = (cand_sf_t *)
                            __ckd_realloc__(ngs->cand_sf,(long)iVar42 * 8 + 0x100,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                            ,0x3b2);
                  ngs->cand_sf = pcVar25;
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x3b4,"cand_sf[] increased to %d entries\n",
                          (ulong)(uint)ngs->cand_sf_alloc);
                }
              }
              plVar53->next = -1;
              iVar42 = pbVar44->frame;
              pcVar25 = ngs->cand_sf;
              uVar29 = (ulong)(int)uVar51;
              uVar51 = uVar51 + 1;
              pcVar25[uVar29].bp_ef = iVar42;
              plVar28 = ngs->last_ltrans;
              lVar52 = (long)plVar53->wid;
              iVar42 = iVar42 + 1;
LAB_0013bebf:
              pcVar25[uVar29].cand = iVar54;
              plVar28[lVar52].dscr = -0x20000000;
              plVar28[lVar52].sf = iVar42;
            }
          }
          iVar54 = iVar54 + 1;
          plVar53 = plVar53 + 1;
          iVar42 = ngs->n_lastphn_cand;
        } while (iVar54 < iVar42);
        if (0 < (int)uVar51) {
          uVar29 = 0;
          do {
            lVar52 = (long)ngs->cand_sf[uVar29].bp_ef;
            iVar54 = ngs->bp_table_idx[lVar52];
            iVar42 = ngs->bp_table_idx[lVar52 + 1];
            local_468 = (dict2pid_t *)uVar29;
            if (iVar54 < iVar42) {
              pbVar44 = ngs->bp_table + iVar54;
              do {
                if (pbVar44->valid != '\0') {
                  uVar21 = ngs->cand_sf[(long)local_468].cand;
                  while (-1 < (int)uVar21) {
                    plVar53 = ngs->lastphn_cand + uVar21;
                    iVar19 = ngram_search_exit_score
                                       (ngs,pbVar44,
                                        (int)*((ngs->base).dict)->word
                                              [ngs->lastphn_cand[uVar21].wid].ciphone);
                    if (-0x20000000 < iVar19) {
                      iVar47 = dict_filler_word((ngs->base).dict,plVar53->wid);
                      if (iVar47 != 0) {
                        __assert_fail("!dict_filler_word(ps_search_dict(ngs), candp->wid)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                      ,0x3d5,"void last_phone_transition(ngram_search_t *, int)");
                      }
                      iVar22 = ngram_tg_score(ngs->lmset,
                                              ((ngs->base).dict)->word[plVar53->wid].basewid,
                                              pbVar44->real_wid,pbVar44->prev_real_wid,local_438);
                      iVar19 = iVar19 + (iVar22 >> 10);
                    }
                    plVar28 = ngs->last_ltrans;
                    iVar47 = plVar53->wid;
                    if (plVar28[iVar47].dscr < iVar19) {
                      plVar28[iVar47].dscr = iVar19;
                      plVar28[iVar47].bp = iVar54;
                    }
                    uVar21 = plVar53->next;
                  }
                }
                iVar54 = iVar54 + 1;
                pbVar44 = pbVar44 + 1;
              } while (iVar54 != iVar42);
            }
            uVar29 = (long)local_468 + 1;
          } while (uVar29 != uVar51);
          iVar42 = ngs->n_lastphn_cand;
        }
        if (0 < iVar42) {
          plVar53 = ngs->lastphn_cand;
          iVar54 = ngs->last_phone_best_score;
          plVar28 = ngs->last_ltrans;
          plVar30 = plVar53;
          iVar47 = iVar42;
          do {
            iVar35 = plVar30->score + plVar28[plVar30->wid].dscr;
            plVar30->score = iVar35;
            plVar30->bp = plVar28[plVar30->wid].bp;
            if (iVar35 <= iVar54) {
              iVar35 = iVar54;
            }
            iVar54 = iVar35;
            plVar30 = plVar30 + 1;
            iVar47 = iVar47 + -1;
          } while (iVar47 != 0);
          ngs->last_phone_best_score = iVar54;
          iVar47 = ngs->lponlybeam;
          do {
            if (iVar54 + iVar47 < plVar53->score) {
              uVar51 = plVar53->wid;
              ngram_search_alloc_all_rc(ngs,uVar51);
              pcVar33 = ngs->word_chan[(int)uVar51];
              if (pcVar33 != (chan_t *)0x0) {
                iVar35 = 0;
                local_468 = (dict2pid_t *)(long)(int)uVar51;
                do {
                  uVar21 = (pcVar33->hmm).frame;
                  if (((int)uVar21 < (int)uVar50) || ((pcVar33->hmm).score[0] < plVar53->score)) {
                    if (uVar21 == uVar55) {
                      __assert_fail("hmm_frame(&hmm->hmm) != nf",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                    ,0x3fc,"void last_phone_transition(ngram_search_t *, int)");
                    }
                    hmm_enter(&pcVar33->hmm,plVar53->score,plVar53->bp,uVar55);
                    iVar35 = iVar35 + 1;
                  }
                  pcVar33 = pcVar33->next;
                } while (pcVar33 != (chan_s *)0x0);
                if (0 < iVar35) {
                  uVar21 = uVar51 + 0x1f;
                  if (-1 < (int)uVar51) {
                    uVar21 = uVar51;
                  }
                  pbVar8 = ngs->word_active;
                  if ((pbVar8[(int)uVar21 >> 5] >> (uVar51 & 0x1f) & 1) != 0) {
                    __assert_fail("bitvec_is_clear(ngs->word_active, w)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x403,"void last_phone_transition(ngram_search_t *, int)");
                  }
                  if (((ngs->base).dict)->word[(long)local_468].pronlen == 1) {
                    __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x404,"void last_phone_transition(ngram_search_t *, int)");
                  }
                  *local_460 = uVar51;
                  local_460 = local_460 + 1;
                  puVar40 = pbVar8 + ((int)uVar21 >> 5);
                  *puVar40 = *puVar40 | (uint)(1L << ((byte)uVar51 & 0x1f));
                }
              }
            }
            plVar53 = plVar53 + 1;
            bVar14 = 1 < iVar42;
            iVar42 = iVar42 + -1;
          } while (bVar14);
        }
      }
      ppiVar9 = ngs->active_word_list;
      piVar26 = ppiVar9[local_450];
      iVar47 = (int)((ulong)((long)local_460 - (long)piVar26) >> 2);
      ngs->n_active_word[local_450] = iVar47;
      iVar42 = ngs->wbeam + ngs->last_phone_best_score;
      iVar54 = ngs->last_phone_best_score + ngs->lponlybeam;
      local_448 = (uint *)(piVar26 + iVar47);
      uVar51 = ngs->n_active_word[local_440];
      local_468 = (dict2pid_t *)CONCAT44(local_468._4_4_,iVar54);
      if (0 < (int)uVar51) {
        puVar40 = (uint *)ppiVar9[local_440];
        do {
          uVar21 = *puVar40;
          uVar29 = (ulong)(int)uVar21;
          pcVar33 = ngs->word_chan[uVar29];
          puVar38 = (uint *)(ulong)uVar51;
          if (pcVar33 != (chan_t *)0x0) {
            ppcVar45 = ngs->word_chan + uVar29;
            iVar47 = 0;
            local_460 = (uint *)(ulong)uVar51;
            local_458 = puVar40;
            local_440 = uVar29;
            do {
              uVar51 = (pcVar33->hmm).frame;
              if ((int)uVar51 < (int)uVar50) {
                __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                              ,0x428,"void prune_word_chan(ngram_search_t *, int)");
              }
              ppcVar18 = &pcVar33->next;
              pcVar48 = pcVar33->next;
              if (iVar54 < (pcVar33->hmm).bestscore) {
                (pcVar33->hmm).frame = uVar55;
                iVar47 = iVar47 + 1;
                iVar19 = (pcVar33->hmm).out_score;
                if (iVar42 < iVar19) {
                  ngram_search_save_bp
                            (ngs,uVar50,uVar21,iVar19,(pcVar33->hmm).out_history,
                             (pcVar33->info).penult_phn_wid);
                  iVar54 = (int)local_468;
                }
              }
              else if (uVar51 != uVar55) {
                hmm_deinit(&pcVar33->hmm);
                __listelem_free__(ngs->chan_alloc,pcVar33,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                  ,0x43f);
                *ppcVar45 = pcVar48;
                ppcVar18 = ppcVar45;
                iVar54 = (int)local_468;
              }
              ppcVar45 = ppcVar18;
              pcVar33 = pcVar48;
            } while (pcVar48 != (chan_s *)0x0);
            puVar38 = local_460;
            puVar40 = local_458;
            if (0 < iVar47) {
              uVar51 = uVar21 + 0x1f;
              if (-1 < (int)uVar21) {
                uVar51 = uVar21;
              }
              pbVar8 = ngs->word_active;
              if ((pbVar8[(int)uVar51 >> 5] >> (uVar21 & 0x1f) & 1) == 0) {
                if (((ngs->base).dict)->word[local_440].pronlen == 1) {
                  __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x444,"void prune_word_chan(ngram_search_t *, int)");
                }
                *local_448 = uVar21;
                local_448 = local_448 + 1;
                puVar1 = pbVar8 + ((int)uVar51 >> 5);
                *puVar1 = *puVar1 | (uint)(1L << ((byte)uVar21 & 0x1f));
              }
            }
          }
          puVar40 = puVar40 + 1;
          uVar51 = (int)puVar38 - 1;
        } while (1 < (int)puVar38);
        piVar26 = ngs->active_word_list[local_450];
      }
      ngs->n_active_word[local_450] = (int32)((ulong)((long)local_448 - (long)piVar26) >> 2);
      iVar47 = ngs->n_1ph_words;
      if (0 < iVar47) {
        lVar52 = 0;
        do {
          iVar35 = ngs->single_phone_wid[lVar52];
          pcVar33 = ngs->word_chan[iVar35];
          if (((int)uVar50 <= (pcVar33->hmm).frame) && (iVar54 < (pcVar33->hmm).bestscore)) {
            (pcVar33->hmm).frame = uVar55;
            iVar19 = (pcVar33->hmm).out_score;
            if (iVar42 < iVar19) {
              ngram_search_save_bp(ngs,uVar50,iVar35,iVar19,(pcVar33->hmm).out_history,0);
              iVar47 = ngs->n_1ph_words;
              iVar54 = (int)local_468;
            }
          }
          lVar52 = lVar52 + 1;
        } while (lVar52 < iVar47);
      }
      if ((ngs->maxwpf != -1) && (ngs->maxwpf != (ngs->base).n_words)) {
        lVar52 = (long)(int)local_46c;
        lVar46 = (long)ngs->bp_table_idx[lVar52];
        iVar54 = ngs->bpidx;
        iVar42 = 0;
        if (ngs->bp_table_idx[lVar52] < iVar54) {
          lVar34 = lVar46 * 0x24;
          lVar49 = 0;
          iVar47 = -0x80000000;
          iVar42 = 0;
          do {
            pbVar44 = ngs->bp_table;
            iVar54 = dict_filler_word((ngs->base).dict,*(s3wid_t *)((long)&pbVar44->wid + lVar34));
            if (iVar54 != 0) {
              iVar54 = *(int *)((long)&pbVar44->score + lVar34);
              if (iVar47 < iVar54) {
                lVar49 = (long)&pbVar44->frame + lVar34;
                iVar47 = iVar54;
              }
              (&pbVar44->valid)[lVar34] = '\0';
              iVar42 = iVar42 + 1;
            }
            lVar46 = lVar46 + 1;
            iVar54 = ngs->bpidx;
            lVar34 = lVar34 + 0x24;
          } while (lVar46 < iVar54);
          if (lVar49 != 0) {
            *(undefined1 *)(lVar49 + 4) = 1;
            iVar42 = iVar42 + -1;
          }
        }
        iVar47 = ngs->bp_table_idx[lVar52];
        iVar42 = (iVar54 - iVar47) - iVar42;
        iVar35 = ngs->maxwpf;
        if (iVar35 < iVar42) {
          if (iVar54 <= iVar47) {
LAB_0013cdc9:
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                    ,0x4d3,"PANIC: No worst BPtable entry remaining\n");
            exit(1);
          }
          pbVar44 = ngs->bp_table;
          do {
            iVar36 = 0x7fffffff;
            pbVar39 = (bptbl_t *)0x0;
            pbVar41 = pbVar44 + iVar47;
            lVar52 = (long)iVar54 - (long)iVar47;
            do {
              if ((pbVar41->valid != '\0') && (pbVar41->score < iVar36)) {
                pbVar39 = pbVar41;
                iVar36 = pbVar41->score;
              }
              pbVar41 = pbVar41 + 1;
              lVar52 = lVar52 + -1;
            } while (lVar52 != 0);
            if (pbVar39 == (bptbl_t *)0x0) goto LAB_0013cdc9;
            pbVar39->valid = '\0';
            iVar42 = iVar42 + -1;
          } while (iVar35 < iVar42);
        }
      }
      uVar50 = local_46c;
      auVar17 = _DAT_00153ac0;
      auVar16 = _DAT_00152bb0;
      auVar15 = _DAT_00152ba0;
      lVar52 = (long)(int)local_46c;
      pdVar10 = (ngs->base).dict;
      local_468 = (ngs->base).d2p;
      pbVar11 = ((ngs->base).acmod)->mdef;
      iVar54 = pbVar11->n_ciphone;
      lVar46 = (long)iVar54;
      if (0 < lVar46) {
        lVar34 = lVar46 + -1;
        auVar56._8_4_ = (int)lVar34;
        auVar56._0_8_ = lVar34;
        auVar56._12_4_ = (int)((ulong)lVar34 >> 0x20);
        pbVar31 = ngs->bestbp_rc + lVar46 + -1;
        uVar29 = 0;
        auVar56 = auVar56 ^ _DAT_00152bb0;
        do {
          auVar57._8_4_ = (int)uVar29;
          auVar57._0_8_ = uVar29;
          auVar57._12_4_ = (int)(uVar29 >> 0x20);
          auVar58 = (auVar57 | auVar15) ^ auVar16;
          iVar42 = auVar56._4_4_;
          if ((bool)(~(auVar58._4_4_ == iVar42 && auVar56._0_4_ < auVar58._0_4_ ||
                      iVar42 < auVar58._4_4_) & 1)) {
            pbVar31->score = -0x20000000;
          }
          if ((auVar58._12_4_ != auVar56._12_4_ || auVar58._8_4_ <= auVar56._8_4_) &&
              auVar58._12_4_ <= auVar56._12_4_) {
            pbVar31[-1].score = -0x20000000;
          }
          auVar57 = (auVar57 | auVar17) ^ auVar16;
          iVar47 = auVar57._4_4_;
          if (iVar47 <= iVar42 && (iVar47 != iVar42 || auVar57._0_4_ <= auVar56._0_4_)) {
            pbVar31[-2].score = -0x20000000;
            pbVar31[-3].score = -0x20000000;
          }
          uVar29 = uVar29 + 4;
          pbVar31 = pbVar31 + -4;
        } while ((iVar54 + 3U & 0xfffffffc) != uVar29);
      }
      lVar46 = (long)ngs->bp_table_idx[lVar52];
      if (ngs->bp_table_idx[lVar52] < ngs->bpidx) {
        ppVar6 = (ngs->base).pls;
        pbVar44 = ngs->bp_table;
        piVar26 = ngs->word_lat_idx;
        iVar54 = 0;
        do {
          piVar26[pbVar44[lVar46].wid] = -1;
          if (pbVar44[lVar46].wid != (ngs->base).finish_wid) {
            iVar54 = iVar54 + 1;
            if ((long)pbVar44[lVar46].last2_phone == -1) {
              iVar42 = pbVar11->n_ciphone;
              if (0 < (long)iVar42) {
                iVar47 = pbVar44[lVar46].score;
                pbVar31 = ngs->bestbp_rc;
                lVar34 = 0;
                do {
                  if (*(int *)((long)&pbVar31->score + lVar34) < iVar47) {
                    *(int *)((long)&pbVar31->score + lVar34) = iVar47;
                    *(int32 *)((long)&pbVar31->path + lVar34) = (int32)lVar46;
                    *(int *)((long)&pbVar31->lc + lVar34) = (int)pbVar44[lVar46].last_phone;
                  }
                  lVar34 = lVar34 + 0xc;
                } while ((long)iVar42 * 0xc != lVar34);
              }
            }
            else {
              iVar42 = pbVar11->n_ciphone;
              if (0 < (long)iVar42) {
                iVar47 = pbVar44[lVar46].s_idx;
                piVar12 = ngs->bscore_stack;
                sVar2 = pbVar44[lVar46].last_phone;
                psVar13 = local_468->rssid[(int)sVar2][pbVar44[lVar46].last2_phone].cimap;
                pbVar31 = ngs->bestbp_rc;
                lVar34 = 0;
                do {
                  if (pbVar31->score < piVar12[(long)iVar47 + (long)psVar13[lVar34]]) {
                    pbVar31->score = piVar12[(long)iVar47 + (long)psVar13[lVar34]];
                    pbVar31->path = (int32)lVar46;
                    pbVar31->lc = (int)sVar2;
                  }
                  lVar34 = lVar34 + 1;
                  pbVar31 = pbVar31 + 1;
                } while (iVar42 != lVar34);
              }
            }
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < ngs->bpidx);
        if (iVar54 != 0) {
          local_460 = (uint *)CONCAT44(local_460._4_4_,local_46c + 1);
          iVar54 = ngs->dynamic_beam + ngs->best_score;
          if (0 < ngs->n_root_chan) {
            prVar32 = ngs->root_chan;
            iVar42 = ngs->n_root_chan + 1;
            do {
              lVar46 = (long)prVar32->ciphone;
              if (ppVar6 == (ps_search_t *)0x0) {
                iVar47 = 0;
              }
              else {
                iVar47 = *(int *)((long)&(ppVar6[1].acmod)->config + lVar46 * 4);
              }
              pbVar31 = ngs->bestbp_rc;
              iVar35 = ngs->nwpen + pbVar31[lVar46].score + ngs->pip;
              if ((iVar54 < iVar47 + iVar35) &&
                 (((prVar32->hmm).frame < (int)uVar50 || ((prVar32->hmm).score[0] < iVar35)))) {
                hmm_enter(&prVar32->hmm,iVar35,pbVar31[lVar46].path,(int)local_460);
                sVar3 = local_468->ldiph_lc[prVar32->ciphone][prVar32->ci2phone][pbVar31[lVar46].lc]
                ;
                (prVar32->hmm).senid[0] = sVar3;
                if (sVar3 == 0xffff) {
                  __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x52e,"void word_transition(ngram_search_t *, int)");
                }
              }
              prVar32 = prVar32 + 1;
              iVar42 = iVar42 + -1;
            } while (1 < iVar42);
          }
          uVar29 = (ulong)ngs->n_1ph_LMwords;
          if (0 < (long)uVar29) {
            piVar26 = ngs->single_phone_wid;
            plVar28 = ngs->last_ltrans;
            uVar37 = 0;
            do {
              plVar28[piVar26[uVar37]].dscr = -0x80000000;
              uVar37 = uVar37 + 1;
            } while (uVar29 != uVar37);
          }
          lVar46 = (long)ngs->bp_table_idx[lVar52];
          iVar42 = ngs->bpidx;
          if (ngs->bp_table_idx[lVar52] < iVar42) {
            local_458 = (uint *)CONCAT44(local_458._4_4_,iVar54);
            do {
              if (0 < (int)uVar29 && ngs->bp_table[lVar46].valid != '\0') {
                pbVar44 = ngs->bp_table + lVar46;
                lVar52 = 0;
                do {
                  iVar54 = ngs->single_phone_wid[lVar52];
                  iVar19 = ngram_search_exit_score(ngs,pbVar44,(int)*pdVar10->word[iVar54].ciphone);
                  iVar42 = -0x20000000;
                  if (iVar19 != -0x20000000) {
                    iVar22 = ngram_tg_score(ngs->lmset,pdVar10->word[iVar54].basewid,
                                            pbVar44->real_wid,pbVar44->prev_real_wid,local_438);
                    iVar42 = (iVar22 >> 10) + iVar19;
                  }
                  plVar28 = ngs->last_ltrans;
                  if (plVar28[iVar54].dscr < iVar42) {
                    plVar28[iVar54].dscr = iVar42;
                    plVar28[iVar54].bp = (int32)lVar46;
                  }
                  lVar52 = lVar52 + 1;
                  uVar29 = (ulong)ngs->n_1ph_LMwords;
                } while (lVar52 < (long)uVar29);
                iVar42 = ngs->bpidx;
                iVar54 = (int)local_458;
              }
              lVar46 = lVar46 + 1;
            } while (lVar46 < iVar42);
          }
          if (0 < (int)uVar29) {
            lVar52 = 0;
            do {
              iVar42 = ngs->single_phone_wid[lVar52];
              if (iVar42 != ((ngs->base).dict)->startwid) {
                pcVar33 = ngs->word_chan[iVar42];
                if (ppVar6 == (ps_search_t *)0x0) {
                  iVar47 = 0;
                }
                else {
                  iVar47 = *(int *)((long)&(ppVar6[1].acmod)->config +
                                   (long)(short)pcVar33->ciphone * 4);
                }
                iVar35 = ngs->pip + ngs->last_ltrans[iVar42].dscr;
                if (iVar54 < iVar47 + iVar35) {
                  pbVar44 = ngs->bp_table;
                  iVar42 = ngs->last_ltrans[iVar42].bp;
                  if (((pcVar33->hmm).frame < (int)uVar50) || ((pcVar33->hmm).score[0] < iVar35)) {
                    hmm_enter(&pcVar33->hmm,iVar35,iVar42,(int)local_460);
                    iVar42 = pbVar44[iVar42].wid;
                    uVar4 = local_468->ldiph_lc[(short)pcVar33->ciphone]
                            [*(short *)((long)&pcVar33->ciphone + 2)]
                            [pdVar10->word[iVar42].ciphone[(long)pdVar10->word[iVar42].pronlen + -1]
                            ];
                    (pcVar33->hmm).senid[0] = uVar4;
                    if (uVar4 == 0xffff) {
                      __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                    ,0x56c,"void word_transition(ngram_search_t *, int)");
                    }
                    uVar29 = (ulong)(uint)ngs->n_1ph_LMwords;
                  }
                }
              }
              lVar52 = lVar52 + 1;
            } while (lVar52 < (int)uVar29);
          }
          iVar42 = ((ngs->base).acmod)->mdef->sil;
          pcVar33 = ngs->word_chan[(ngs->base).silence_wid];
          iVar47 = ngs->silpen + ngs->bestbp_rc[iVar42].score + ngs->pip;
          if (ppVar6 == (ps_search_t *)0x0) {
            iVar35 = 0;
          }
          else {
            iVar35 = *(int *)((long)&(ppVar6[1].acmod)->config + (long)(short)pcVar33->ciphone * 4);
          }
          pbVar31 = ngs->bestbp_rc + iVar42;
          if ((iVar54 < iVar35 + iVar47) &&
             (((pcVar33->hmm).frame < (int)uVar50 || ((pcVar33->hmm).score[0] < iVar47)))) {
            hmm_enter(&pcVar33->hmm,iVar47,pbVar31->path,(int)local_460);
          }
          iVar42 = pdVar10->filler_start;
          iVar47 = pdVar10->filler_end;
          if (iVar42 <= iVar47) {
            lVar52 = (long)iVar42 + -1;
            do {
              if (((iVar42 != (ngs->base).silence_wid) && (iVar42 != ((ngs->base).dict)->startwid))
                 && (pcVar33 = ngs->word_chan[lVar52 + 1], pcVar33 != (chan_t *)0x0)) {
                if (ppVar6 == (ps_search_t *)0x0) {
                  iVar35 = 0;
                }
                else {
                  iVar35 = *(int *)((long)&(ppVar6[1].acmod)->config +
                                   (long)(short)pcVar33->ciphone * 4);
                }
                iVar36 = ngs->fillpen + pbVar31->score + ngs->pip;
                if ((iVar54 < iVar35 + iVar36) &&
                   (((pcVar33->hmm).frame < (int)uVar50 || ((pcVar33->hmm).score[0] < iVar36)))) {
                  hmm_enter(&pcVar33->hmm,iVar36,pbVar31->path,(int)local_460);
                  iVar47 = pdVar10->filler_end;
                }
              }
              lVar52 = lVar52 + 1;
              iVar42 = iVar42 + 1;
            } while (lVar52 < iVar47);
          }
        }
      }
      uVar50 = local_46c;
      if (0 < ngs->n_root_chan) {
        prVar32 = ngs->root_chan;
        iVar54 = ngs->n_root_chan + 1;
        do {
          if ((prVar32->hmm).frame == uVar50) {
            hmm_clear(&prVar32->hmm);
          }
          prVar32 = prVar32 + 1;
          iVar54 = iVar54 + -1;
        } while (1 < iVar54);
      }
      iVar54 = ngs->n_1ph_words;
      if (0 < iVar54) {
        lVar52 = 0;
        do {
          if ((ngs->word_chan[ngs->single_phone_wid[lVar52]]->hmm).frame == uVar50) {
            hmm_clear(&ngs->word_chan[ngs->single_phone_wid[lVar52]]->hmm);
            iVar54 = ngs->n_1ph_words;
          }
          lVar52 = lVar52 + 1;
        } while (lVar52 < iVar54);
      }
      ngs->n_frame = ngs->n_frame + 1;
      iVar54 = 1;
    }
  }
  return iVar54;
}

Assistant:

int
ngram_fwdtree_search(ngram_search_t *ngs, int frame_idx)
{
    int16 const *senscr;

    /* Activate our HMMs for the current frame if need be. */
    if (!ps_search_acmod(ngs)->compallsen)
        compute_sen_active(ngs, frame_idx);

    /* Compute GMM scores for the current frame. */
    if ((senscr = acmod_score(ps_search_acmod(ngs), &frame_idx)) == NULL)
        return 0;
    ngs->st.n_senone_active_utt += ps_search_acmod(ngs)->n_senone_active;

    /* Mark backpointer table for current frame. */
    ngram_search_mark_bptable(ngs, frame_idx);

    /* If the best score is equal to or worse than WORST_SCORE,
     * recognition has failed, don't bother to keep trying. */
    if (ngs->best_score == WORST_SCORE || ngs->best_score WORSE_THAN WORST_SCORE)
        return 0;
    /* Renormalize if necessary */
    if (ngs->best_score + (2 * ngs->beam) WORSE_THAN WORST_SCORE) {
        E_INFO("Renormalizing Scores at frame %d, best score %d\n",
               frame_idx, ngs->best_score);
        renormalize_scores(ngs, frame_idx, ngs->best_score);
    }

    /* Evaluate HMMs */
    evaluate_channels(ngs, senscr, frame_idx);
    /* Prune HMMs and do phone transitions. */
    prune_channels(ngs, frame_idx);
    /* Do absolute pruning on word exits. */
    bptable_maxwpf(ngs, frame_idx);
    /* Do word transitions. */
    word_transition(ngs, frame_idx);
    /* Deactivate pruned HMMs. */
    deactivate_channels(ngs, frame_idx);

    ++ngs->n_frame;
    /* Return the number of frames processed. */
    return 1;
}